

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_advance_uint32_iterator(roaring_uint32_iterator_t *it)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  long lVar4;
  byte bVar5;
  _Bool _Var6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  
  iVar3 = it->container_index;
  if (iVar3 < (it->parent->high_low_container).size) {
    if (iVar3 < 0) {
      it->container_index = 0;
    }
    else {
      if (it->typecode == '\x03') {
        uVar7 = it->current_value;
        if (uVar7 == 0xffffffff) goto LAB_00113eb8;
        lVar4 = *(long *)((long)it->container + 8);
        lVar10 = (long)it->run_index;
        uVar1 = *(ushort *)(lVar4 + lVar10 * 4);
        uVar2 = *(ushort *)(lVar4 + 2 + lVar10 * 4);
        it->current_value = uVar7 + 1;
        if (uVar7 < ((uint)uVar2 + (uint)uVar1 | it->highbits)) goto LAB_00113f1e;
        iVar8 = it->run_index + 1;
        it->run_index = iVar8;
        if (iVar8 < *it->container) {
          uVar7 = it->highbits | (uint)*(ushort *)(lVar4 + 4 + lVar10 * 4);
          goto LAB_00113eb3;
        }
      }
      else if (it->typecode == '\x02') {
        iVar8 = it->in_container_index;
        iVar9 = iVar8 + 1;
        it->in_container_index = iVar9;
        if (iVar9 < *it->container) {
          uVar7 = (uint)*(ushort *)(*(long *)((long)it->container + 8) + 2 + (long)iVar8 * 2) |
                  it->highbits;
LAB_00113eb3:
          it->current_value = uVar7;
LAB_00113f1e:
          it->has_value = true;
          return true;
        }
      }
      else {
        iVar8 = it->in_container_index + 1;
        it->in_container_index = iVar8;
        bVar5 = (byte)(iVar8 % 0x40);
        uVar7 = (uint)((long)iVar8 / 0x40);
        if (uVar7 < 0x400) {
          lVar4 = *(long *)((long)it->container + 8);
          uVar12 = (long)iVar8 / 0x40 & 0xffffffff;
          uVar11 = (*(ulong *)(lVar4 + uVar12 * 8) >> (bVar5 & 0x3f)) << (bVar5 & 0x3f);
          iVar8 = uVar7 << 6;
          for (; (uVar11 == 0 && (uVar12 < 0x3ff)); uVar12 = uVar12 + 1) {
            uVar11 = *(ulong *)(lVar4 + 8 + uVar12 * 8);
            iVar8 = iVar8 + 0x40;
          }
          if (uVar11 != 0) {
            lVar4 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
              }
            }
            uVar7 = (int)lVar4 + iVar8;
            it->in_container_index = uVar7;
            it->current_value = uVar7 | it->highbits;
            goto LAB_00113f1e;
          }
        }
      }
      it->container_index = iVar3 + 1;
    }
    _Var6 = loadfirstvalue(it);
    it->has_value = _Var6;
  }
  else {
LAB_00113eb8:
    it->has_value = false;
    _Var6 = false;
  }
  return _Var6;
}

Assistant:

bool roaring_advance_uint32_iterator(roaring_uint32_iterator_t *it) {
    if (it->container_index >= it->parent->high_low_container.size) {
        return (it->has_value = false);
    }
    if (it->container_index < 0) {
        it->container_index = 0;
        return (it->has_value = loadfirstvalue(it));
    }

    switch (it->typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(it->container);
            it->in_container_index++;

            uint32_t wordindex = it->in_container_index / 64;
            if (wordindex >= BITSET_CONTAINER_SIZE_IN_WORDS) break;

            uint64_t word = bc->words[wordindex] &
                   (UINT64_MAX << (it->in_container_index % 64));
            // next part could be optimized/simplified
            while ((word == 0) &&
                   (wordindex + 1 < BITSET_CONTAINER_SIZE_IN_WORDS)) {
                wordindex++;
                word = bc->words[wordindex];
            }
            if (word != 0) {
                it->in_container_index = wordindex * 64 + __builtin_ctzll(word);
                it->current_value = it->highbits | it->in_container_index;
                return (it->has_value = true);
            }
            break; }

        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(it->container);
            it->in_container_index++;
            if (it->in_container_index < ac->cardinality) {
                it->current_value =
                        it->highbits | ac->array[it->in_container_index];
                return (it->has_value = true);
            }
            break; }

        case RUN_CONTAINER_TYPE: {
            if(it->current_value == UINT32_MAX) {  // avoid overflow to zero
                return (it->has_value = false);
            }

            const run_container_t* rc = const_CAST_run(it->container);
            uint32_t limit = (it->highbits | (rc->runs[it->run_index].value +
                                              rc->runs[it->run_index].length));
            if (++it->current_value <= limit) {
                return (it->has_value = true);
            }

            if (++it->run_index < rc->n_runs) {  // Assume the run has a value
                it->current_value =
                        it->highbits | rc->runs[it->run_index].value;
                return (it->has_value = true);
            }
            break;
        }

        default:
            __builtin_unreachable();
    }

    // moving to next container
    it->container_index++;
    return (it->has_value = loadfirstvalue(it));
}